

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-multi-accept.c
# Opt level: O3

void cl_close_cb(uv_handle_t *handle)

{
  int *piVar1;
  int iVar2;
  uv_loop_t *loop;
  
  piVar1 = (int *)((long)&handle[2].u + 0x18);
  *piVar1 = *piVar1 + -1;
  if (*piVar1 == 0) {
    uv_close((uv_handle_t *)&handle[3].next_closing,(uv_close_cb)0x0);
    return;
  }
  loop = handle->loop;
  iVar2 = uv_tcp_init(loop,(uv_tcp_t *)handle);
  if (iVar2 == 0) {
    loop = (uv_loop_t *)&handle[2].next_closing;
    iVar2 = uv_tcp_connect((uv_connect_t *)loop,(uv_tcp_t *)handle,(sockaddr *)&listen_addr,
                           cl_connect_cb);
    if (iVar2 == 0) {
      return;
    }
  }
  else {
    cl_close_cb_cold_1();
  }
  cl_close_cb_cold_2();
  iVar2 = uv_is_closing((uv_handle_t *)loop);
  if (iVar2 != 0) {
    return;
  }
  uv_close((uv_handle_t *)loop,(uv_close_cb)0x0);
  return;
}

Assistant:

static void cl_close_cb(uv_handle_t* handle) {
  struct client_ctx* ctx;

  ctx = container_of(handle, struct client_ctx, client_handle);

  if (--ctx->num_connects == 0) {
    uv_close((uv_handle_t*) &ctx->idle_handle, NULL);
    return;
  }

  ASSERT(0 == uv_tcp_init(handle->loop, (uv_tcp_t*) &ctx->client_handle));
  ASSERT(0 == uv_tcp_connect(&ctx->connect_req,
                             (uv_tcp_t*) &ctx->client_handle,
                             (const struct sockaddr*) &listen_addr,
                             cl_connect_cb));
}